

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8.h
# Opt level: O3

void ncnn::conv2x2s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [32];
  undefined4 *puVar13;
  undefined4 *puVar14;
  long lVar15;
  undefined4 *puVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 local_58 [32];
  
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    uVar3 = top_blob->w;
    iVar4 = top_blob->h;
    uVar5 = bottom_blob->c;
    lVar15 = 0;
    do {
      iVar17 = 1;
      if (top_blob->dims != 3) {
        iVar17 = top_blob->d;
      }
      if (_bias == (Mat *)0x0) {
        auVar22 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        auVar22 = *(undefined1 (*) [32])(&_bias->data + lVar15 * 4);
      }
      pauVar12 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar15 * top_blob->elemsize + (long)top_blob->data);
      iVar17 = iVar17 * top_blob->h * top_blob->w;
      pauVar11 = pauVar12;
      if (0 < iVar17) {
        do {
          *pauVar11 = auVar22;
          iVar17 = iVar17 + -1;
          pauVar11 = pauVar11 + 1;
        } while (iVar17 != 0);
      }
      if (0 < (int)uVar5) {
        uVar21 = 0;
        do {
          if (0 < iVar4) {
            lVar20 = kernel->cstep * lVar15 * kernel->elemsize;
            pvVar6 = kernel->data;
            lVar19 = (long)kernel->w * uVar21 * kernel->elemsize;
            puVar13 = (undefined4 *)
                      (bottom_blob->cstep * uVar21 * bottom_blob->elemsize + (long)bottom_blob->data
                      );
            puVar16 = (undefined4 *)((long)bottom_blob->w * bottom_blob->elemsize + (long)puVar13);
            iVar17 = 0;
            pauVar11 = pauVar12;
            do {
              if ((int)uVar3 < 2) {
                uVar10 = 0;
              }
              else {
                iVar18 = 1;
                do {
                  uVar1 = *puVar13;
                  auVar27._4_4_ = uVar1;
                  auVar27._0_4_ = uVar1;
                  auVar27._8_4_ = uVar1;
                  auVar27._12_4_ = uVar1;
                  auVar27._16_4_ = uVar1;
                  auVar27._20_4_ = uVar1;
                  auVar27._24_4_ = uVar1;
                  auVar27._28_4_ = uVar1;
                  uVar1 = puVar13[1];
                  auVar31._4_4_ = uVar1;
                  auVar31._0_4_ = uVar1;
                  auVar31._8_4_ = uVar1;
                  auVar31._12_4_ = uVar1;
                  auVar31._16_4_ = uVar1;
                  auVar31._20_4_ = uVar1;
                  auVar31._24_4_ = uVar1;
                  auVar31._28_4_ = uVar1;
                  uVar1 = puVar13[2];
                  auVar51._4_4_ = uVar1;
                  auVar51._0_4_ = uVar1;
                  auVar51._8_4_ = uVar1;
                  auVar51._12_4_ = uVar1;
                  auVar51._16_4_ = uVar1;
                  auVar51._20_4_ = uVar1;
                  auVar51._24_4_ = uVar1;
                  auVar51._28_4_ = uVar1;
                  uVar1 = puVar13[3];
                  auVar73._4_4_ = uVar1;
                  auVar73._0_4_ = uVar1;
                  auVar73._8_4_ = uVar1;
                  auVar73._12_4_ = uVar1;
                  auVar73._16_4_ = uVar1;
                  auVar73._20_4_ = uVar1;
                  auVar73._24_4_ = uVar1;
                  auVar73._28_4_ = uVar1;
                  uVar1 = puVar13[4];
                  auVar80._4_4_ = uVar1;
                  auVar80._0_4_ = uVar1;
                  auVar80._8_4_ = uVar1;
                  auVar80._12_4_ = uVar1;
                  auVar80._16_4_ = uVar1;
                  auVar80._20_4_ = uVar1;
                  auVar80._24_4_ = uVar1;
                  auVar80._28_4_ = uVar1;
                  uVar1 = puVar13[5];
                  auVar90._4_4_ = uVar1;
                  auVar90._0_4_ = uVar1;
                  auVar90._8_4_ = uVar1;
                  auVar90._12_4_ = uVar1;
                  auVar90._16_4_ = uVar1;
                  auVar90._20_4_ = uVar1;
                  auVar90._24_4_ = uVar1;
                  auVar90._28_4_ = uVar1;
                  uVar1 = puVar13[6];
                  auVar92._4_4_ = uVar1;
                  auVar92._0_4_ = uVar1;
                  auVar92._8_4_ = uVar1;
                  auVar92._12_4_ = uVar1;
                  auVar92._16_4_ = uVar1;
                  auVar92._20_4_ = uVar1;
                  auVar92._24_4_ = uVar1;
                  auVar92._28_4_ = uVar1;
                  uVar1 = puVar13[7];
                  auVar65._4_4_ = uVar1;
                  auVar65._0_4_ = uVar1;
                  auVar65._8_4_ = uVar1;
                  auVar65._12_4_ = uVar1;
                  auVar65._16_4_ = uVar1;
                  auVar65._20_4_ = uVar1;
                  auVar65._24_4_ = uVar1;
                  auVar65._28_4_ = uVar1;
                  auVar22 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20);
                  auVar34 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x20);
                  auVar35 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x40);
                  auVar36 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x60);
                  auVar7 = vfmadd213ps_fma(auVar27,auVar22,*pauVar11);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar34,auVar31);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar35,auVar51);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar36,auVar73);
                  auVar23 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x80);
                  auVar27 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0xa0);
                  auVar31 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0xc0);
                  auVar37 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0xe0);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar23,auVar80);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar27,auVar90);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar31,auVar92);
                  uVar1 = puVar13[8];
                  auVar45._4_4_ = uVar1;
                  auVar45._0_4_ = uVar1;
                  auVar45._8_4_ = uVar1;
                  auVar45._12_4_ = uVar1;
                  auVar45._16_4_ = uVar1;
                  auVar45._20_4_ = uVar1;
                  auVar45._24_4_ = uVar1;
                  auVar45._28_4_ = uVar1;
                  uVar1 = puVar13[9];
                  auVar97._4_4_ = uVar1;
                  auVar97._0_4_ = uVar1;
                  auVar97._8_4_ = uVar1;
                  auVar97._12_4_ = uVar1;
                  auVar97._16_4_ = uVar1;
                  auVar97._20_4_ = uVar1;
                  auVar97._24_4_ = uVar1;
                  auVar97._28_4_ = uVar1;
                  uVar1 = puVar13[10];
                  auVar91._4_4_ = uVar1;
                  auVar91._0_4_ = uVar1;
                  auVar91._8_4_ = uVar1;
                  auVar91._12_4_ = uVar1;
                  auVar91._16_4_ = uVar1;
                  auVar91._20_4_ = uVar1;
                  auVar91._24_4_ = uVar1;
                  auVar91._28_4_ = uVar1;
                  uVar1 = puVar13[0xb];
                  auVar81._4_4_ = uVar1;
                  auVar81._0_4_ = uVar1;
                  auVar81._8_4_ = uVar1;
                  auVar81._12_4_ = uVar1;
                  auVar81._16_4_ = uVar1;
                  auVar81._20_4_ = uVar1;
                  auVar81._24_4_ = uVar1;
                  auVar81._28_4_ = uVar1;
                  uVar1 = puVar13[0xc];
                  auVar52._4_4_ = uVar1;
                  auVar52._0_4_ = uVar1;
                  auVar52._8_4_ = uVar1;
                  auVar52._12_4_ = uVar1;
                  auVar52._16_4_ = uVar1;
                  auVar52._20_4_ = uVar1;
                  auVar52._24_4_ = uVar1;
                  auVar52._28_4_ = uVar1;
                  uVar1 = puVar13[0xd];
                  auVar32._4_4_ = uVar1;
                  auVar32._0_4_ = uVar1;
                  auVar32._8_4_ = uVar1;
                  auVar32._12_4_ = uVar1;
                  auVar32._16_4_ = uVar1;
                  auVar32._20_4_ = uVar1;
                  auVar32._24_4_ = uVar1;
                  auVar32._28_4_ = uVar1;
                  auVar7 = vfmadd213ps_fma(auVar22,auVar45,pauVar11[1]);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar37,auVar65);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar97,auVar34);
                  uVar1 = puVar13[0xe];
                  auVar93._4_4_ = uVar1;
                  auVar93._0_4_ = uVar1;
                  auVar93._8_4_ = uVar1;
                  auVar93._12_4_ = uVar1;
                  auVar93._16_4_ = uVar1;
                  auVar93._20_4_ = uVar1;
                  auVar93._24_4_ = uVar1;
                  auVar93._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar91,auVar35);
                  uVar1 = puVar13[0xf];
                  auVar66._4_4_ = uVar1;
                  auVar66._0_4_ = uVar1;
                  auVar66._8_4_ = uVar1;
                  auVar66._12_4_ = uVar1;
                  auVar66._16_4_ = uVar1;
                  auVar66._20_4_ = uVar1;
                  auVar66._24_4_ = uVar1;
                  auVar66._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar81,auVar36);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar52,auVar23);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar32,auVar27);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar93,auVar31);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar66,auVar37);
                  auVar22 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x100);
                  auVar34 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x120);
                  auVar35 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x140);
                  auVar36 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x160);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar22,auVar45);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar34,auVar97);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar35,auVar91);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar36,auVar81);
                  auVar23 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x180);
                  auVar27 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x1a0);
                  auVar31 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x1c0);
                  auVar37 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x1e0);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar23,auVar52);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar27,auVar32);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar31,auVar93);
                  uVar1 = puVar13[0x10];
                  auVar33._4_4_ = uVar1;
                  auVar33._0_4_ = uVar1;
                  auVar33._8_4_ = uVar1;
                  auVar33._12_4_ = uVar1;
                  auVar33._16_4_ = uVar1;
                  auVar33._20_4_ = uVar1;
                  auVar33._24_4_ = uVar1;
                  auVar33._28_4_ = uVar1;
                  uVar1 = puVar13[0x11];
                  auVar53._4_4_ = uVar1;
                  auVar53._0_4_ = uVar1;
                  auVar53._8_4_ = uVar1;
                  auVar53._12_4_ = uVar1;
                  auVar53._16_4_ = uVar1;
                  auVar53._20_4_ = uVar1;
                  auVar53._24_4_ = uVar1;
                  auVar53._28_4_ = uVar1;
                  uVar1 = puVar13[0x12];
                  auVar94._4_4_ = uVar1;
                  auVar94._0_4_ = uVar1;
                  auVar94._8_4_ = uVar1;
                  auVar94._12_4_ = uVar1;
                  auVar94._16_4_ = uVar1;
                  auVar94._20_4_ = uVar1;
                  auVar94._24_4_ = uVar1;
                  auVar94._28_4_ = uVar1;
                  uVar1 = puVar13[0x13];
                  auVar98._4_4_ = uVar1;
                  auVar98._0_4_ = uVar1;
                  auVar98._8_4_ = uVar1;
                  auVar98._12_4_ = uVar1;
                  auVar98._16_4_ = uVar1;
                  auVar98._20_4_ = uVar1;
                  auVar98._24_4_ = uVar1;
                  auVar98._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar37,auVar66);
                  uVar1 = puVar13[0x14];
                  auVar67._4_4_ = uVar1;
                  auVar67._0_4_ = uVar1;
                  auVar67._8_4_ = uVar1;
                  auVar67._12_4_ = uVar1;
                  auVar67._16_4_ = uVar1;
                  auVar67._20_4_ = uVar1;
                  auVar67._24_4_ = uVar1;
                  auVar67._28_4_ = uVar1;
                  auVar7 = vfmadd213ps_fma(auVar33,auVar22,ZEXT1632(auVar7));
                  uVar1 = puVar13[0x15];
                  auVar22._4_4_ = uVar1;
                  auVar22._0_4_ = uVar1;
                  auVar22._8_4_ = uVar1;
                  auVar22._12_4_ = uVar1;
                  auVar22._16_4_ = uVar1;
                  auVar22._20_4_ = uVar1;
                  auVar22._24_4_ = uVar1;
                  auVar22._28_4_ = uVar1;
                  uVar1 = puVar13[0x16];
                  auVar88._4_4_ = uVar1;
                  auVar88._0_4_ = uVar1;
                  auVar88._8_4_ = uVar1;
                  auVar88._12_4_ = uVar1;
                  auVar88._16_4_ = uVar1;
                  auVar88._20_4_ = uVar1;
                  auVar88._24_4_ = uVar1;
                  auVar88._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar34,auVar53);
                  uVar1 = puVar13[0x17];
                  auVar54._4_4_ = uVar1;
                  auVar54._0_4_ = uVar1;
                  auVar54._8_4_ = uVar1;
                  auVar54._12_4_ = uVar1;
                  auVar54._16_4_ = uVar1;
                  auVar54._20_4_ = uVar1;
                  auVar54._24_4_ = uVar1;
                  auVar54._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar35,auVar94);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar36,auVar98);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar23,auVar67);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar27,auVar22);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar31,auVar88);
                  uVar1 = *puVar16;
                  auVar23._4_4_ = uVar1;
                  auVar23._0_4_ = uVar1;
                  auVar23._8_4_ = uVar1;
                  auVar23._12_4_ = uVar1;
                  auVar23._16_4_ = uVar1;
                  auVar23._20_4_ = uVar1;
                  auVar23._24_4_ = uVar1;
                  auVar23._28_4_ = uVar1;
                  uVar1 = puVar16[1];
                  auVar74._4_4_ = uVar1;
                  auVar74._0_4_ = uVar1;
                  auVar74._8_4_ = uVar1;
                  auVar74._12_4_ = uVar1;
                  auVar74._16_4_ = uVar1;
                  auVar74._20_4_ = uVar1;
                  auVar74._24_4_ = uVar1;
                  auVar74._28_4_ = uVar1;
                  uVar1 = puVar16[2];
                  auVar82._4_4_ = uVar1;
                  auVar82._0_4_ = uVar1;
                  auVar82._8_4_ = uVar1;
                  auVar82._12_4_ = uVar1;
                  auVar82._16_4_ = uVar1;
                  auVar82._20_4_ = uVar1;
                  auVar82._24_4_ = uVar1;
                  auVar82._28_4_ = uVar1;
                  uVar1 = puVar16[3];
                  auVar86._4_4_ = uVar1;
                  auVar86._0_4_ = uVar1;
                  auVar86._8_4_ = uVar1;
                  auVar86._12_4_ = uVar1;
                  auVar86._16_4_ = uVar1;
                  auVar86._20_4_ = uVar1;
                  auVar86._24_4_ = uVar1;
                  auVar86._28_4_ = uVar1;
                  uVar1 = puVar16[4];
                  auVar95._4_4_ = uVar1;
                  auVar95._0_4_ = uVar1;
                  auVar95._8_4_ = uVar1;
                  auVar95._12_4_ = uVar1;
                  auVar95._16_4_ = uVar1;
                  auVar95._20_4_ = uVar1;
                  auVar95._24_4_ = uVar1;
                  auVar95._28_4_ = uVar1;
                  uVar1 = puVar16[5];
                  auVar99._4_4_ = uVar1;
                  auVar99._0_4_ = uVar1;
                  auVar99._8_4_ = uVar1;
                  auVar99._12_4_ = uVar1;
                  auVar99._16_4_ = uVar1;
                  auVar99._20_4_ = uVar1;
                  auVar99._24_4_ = uVar1;
                  auVar99._28_4_ = uVar1;
                  uVar1 = puVar16[6];
                  auVar100._4_4_ = uVar1;
                  auVar100._0_4_ = uVar1;
                  auVar100._8_4_ = uVar1;
                  auVar100._12_4_ = uVar1;
                  auVar100._16_4_ = uVar1;
                  auVar100._20_4_ = uVar1;
                  auVar100._24_4_ = uVar1;
                  auVar100._28_4_ = uVar1;
                  local_58._4_4_ = puVar16[7];
                  local_58._0_4_ = local_58._4_4_;
                  local_58._8_4_ = local_58._4_4_;
                  local_58._12_4_ = local_58._4_4_;
                  local_58._16_4_ = local_58._4_4_;
                  local_58._20_4_ = local_58._4_4_;
                  local_58._24_4_ = local_58._4_4_;
                  local_58._28_4_ = local_58._4_4_;
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar37,auVar54);
                  auVar22 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x200);
                  auVar34 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x220);
                  auVar35 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x240);
                  auVar36 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x260);
                  auVar7 = vfmadd213ps_fma(auVar23,auVar22,ZEXT1632(auVar8));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar34,auVar74);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar35,auVar82);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar36,auVar86);
                  auVar23 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x280);
                  auVar27 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x2a0);
                  auVar31 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x2c0);
                  auVar37 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x2e0);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar23,auVar95);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar27,auVar99);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar31,auVar100);
                  uVar1 = puVar16[8];
                  auVar87._4_4_ = uVar1;
                  auVar87._0_4_ = uVar1;
                  auVar87._8_4_ = uVar1;
                  auVar87._12_4_ = uVar1;
                  auVar87._16_4_ = uVar1;
                  auVar87._20_4_ = uVar1;
                  auVar87._24_4_ = uVar1;
                  auVar87._28_4_ = uVar1;
                  uVar1 = puVar16[9];
                  auVar83._4_4_ = uVar1;
                  auVar83._0_4_ = uVar1;
                  auVar83._8_4_ = uVar1;
                  auVar83._12_4_ = uVar1;
                  auVar83._16_4_ = uVar1;
                  auVar83._20_4_ = uVar1;
                  auVar83._24_4_ = uVar1;
                  auVar83._28_4_ = uVar1;
                  uVar1 = puVar16[10];
                  auVar75._4_4_ = uVar1;
                  auVar75._0_4_ = uVar1;
                  auVar75._8_4_ = uVar1;
                  auVar75._12_4_ = uVar1;
                  auVar75._16_4_ = uVar1;
                  auVar75._20_4_ = uVar1;
                  auVar75._24_4_ = uVar1;
                  auVar75._28_4_ = uVar1;
                  uVar1 = puVar16[0xb];
                  auVar96._4_4_ = uVar1;
                  auVar96._0_4_ = uVar1;
                  auVar96._8_4_ = uVar1;
                  auVar96._12_4_ = uVar1;
                  auVar96._16_4_ = uVar1;
                  auVar96._20_4_ = uVar1;
                  auVar96._24_4_ = uVar1;
                  auVar96._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar37,local_58);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar87,auVar22);
                  uVar1 = puVar16[0xc];
                  auVar55._4_4_ = uVar1;
                  auVar55._0_4_ = uVar1;
                  auVar55._8_4_ = uVar1;
                  auVar55._12_4_ = uVar1;
                  auVar55._16_4_ = uVar1;
                  auVar55._20_4_ = uVar1;
                  auVar55._24_4_ = uVar1;
                  auVar55._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar83,auVar34);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar75,auVar35);
                  uVar1 = puVar16[0xd];
                  auVar60._4_4_ = uVar1;
                  auVar60._0_4_ = uVar1;
                  auVar60._8_4_ = uVar1;
                  auVar60._12_4_ = uVar1;
                  auVar60._16_4_ = uVar1;
                  auVar60._20_4_ = uVar1;
                  auVar60._24_4_ = uVar1;
                  auVar60._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar96,auVar36);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar55,auVar23);
                  uVar1 = puVar16[0xe];
                  auVar68._4_4_ = uVar1;
                  auVar68._0_4_ = uVar1;
                  auVar68._8_4_ = uVar1;
                  auVar68._12_4_ = uVar1;
                  auVar68._16_4_ = uVar1;
                  auVar68._20_4_ = uVar1;
                  auVar68._24_4_ = uVar1;
                  auVar68._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar60,auVar27);
                  uVar1 = puVar16[0xf];
                  auVar46._4_4_ = uVar1;
                  auVar46._0_4_ = uVar1;
                  auVar46._8_4_ = uVar1;
                  auVar46._12_4_ = uVar1;
                  auVar46._16_4_ = uVar1;
                  auVar46._20_4_ = uVar1;
                  auVar46._24_4_ = uVar1;
                  auVar46._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar68,auVar31);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar46,auVar37);
                  auVar22 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x300);
                  uVar1 = puVar16[0x10];
                  auVar89._4_4_ = uVar1;
                  auVar89._0_4_ = uVar1;
                  auVar89._8_4_ = uVar1;
                  auVar89._12_4_ = uVar1;
                  auVar89._16_4_ = uVar1;
                  auVar89._20_4_ = uVar1;
                  auVar89._24_4_ = uVar1;
                  auVar89._28_4_ = uVar1;
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar22,auVar87);
                  auVar7 = vfmadd213ps_fma(auVar89,auVar22,ZEXT1632(auVar8));
                  auVar22 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 800);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar22,auVar83);
                  uVar1 = puVar16[0x11];
                  auVar34._4_4_ = uVar1;
                  auVar34._0_4_ = uVar1;
                  auVar34._8_4_ = uVar1;
                  auVar34._12_4_ = uVar1;
                  auVar34._16_4_ = uVar1;
                  auVar34._20_4_ = uVar1;
                  auVar34._24_4_ = uVar1;
                  auVar34._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar22,auVar34);
                  auVar22 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x340);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar22,auVar75);
                  uVar1 = puVar16[0x12];
                  auVar35._4_4_ = uVar1;
                  auVar35._0_4_ = uVar1;
                  auVar35._8_4_ = uVar1;
                  auVar35._12_4_ = uVar1;
                  auVar35._16_4_ = uVar1;
                  auVar35._20_4_ = uVar1;
                  auVar35._24_4_ = uVar1;
                  auVar35._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar22,auVar35);
                  auVar22 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x360);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar22,auVar96);
                  uVar1 = puVar16[0x13];
                  auVar36._4_4_ = uVar1;
                  auVar36._0_4_ = uVar1;
                  auVar36._8_4_ = uVar1;
                  auVar36._12_4_ = uVar1;
                  auVar36._16_4_ = uVar1;
                  auVar36._20_4_ = uVar1;
                  auVar36._24_4_ = uVar1;
                  auVar36._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar22,auVar36);
                  auVar22 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x380);
                  uVar1 = puVar16[0x14];
                  auVar37._4_4_ = uVar1;
                  auVar37._0_4_ = uVar1;
                  auVar37._8_4_ = uVar1;
                  auVar37._12_4_ = uVar1;
                  auVar37._16_4_ = uVar1;
                  auVar37._20_4_ = uVar1;
                  auVar37._24_4_ = uVar1;
                  auVar37._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar22,auVar55);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar22,auVar37);
                  auVar22 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x3a0);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar22,auVar60);
                  uVar1 = puVar16[0x15];
                  auVar38._4_4_ = uVar1;
                  auVar38._0_4_ = uVar1;
                  auVar38._8_4_ = uVar1;
                  auVar38._12_4_ = uVar1;
                  auVar38._16_4_ = uVar1;
                  auVar38._20_4_ = uVar1;
                  auVar38._24_4_ = uVar1;
                  auVar38._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar22,auVar38);
                  auVar22 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x3c0);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar22,auVar68);
                  uVar1 = puVar16[0x16];
                  auVar39._4_4_ = uVar1;
                  auVar39._0_4_ = uVar1;
                  auVar39._8_4_ = uVar1;
                  auVar39._12_4_ = uVar1;
                  auVar39._16_4_ = uVar1;
                  auVar39._20_4_ = uVar1;
                  auVar39._24_4_ = uVar1;
                  auVar39._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar22,auVar39);
                  auVar22 = *(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20 + 0x3e0);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar22,auVar46);
                  uVar1 = puVar16[0x17];
                  auVar40._4_4_ = uVar1;
                  auVar40._0_4_ = uVar1;
                  auVar40._8_4_ = uVar1;
                  auVar40._12_4_ = uVar1;
                  auVar40._16_4_ = uVar1;
                  auVar40._20_4_ = uVar1;
                  auVar40._24_4_ = uVar1;
                  auVar40._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar22,auVar40);
                  *pauVar11 = ZEXT1632(auVar8);
                  pauVar11[1] = ZEXT1632(auVar7);
                  puVar13 = puVar13 + 0x10;
                  puVar16 = puVar16 + 0x10;
                  pauVar11 = pauVar11 + 2;
                  iVar18 = iVar18 + 2;
                  uVar10 = uVar3 & 0xfffffffe;
                } while (iVar18 < (int)uVar3);
              }
              iVar18 = uVar3 - uVar10;
              puVar14 = puVar13;
              if (iVar18 != 0 && (int)uVar10 <= (int)uVar3) {
                do {
                  uVar1 = *puVar14;
                  auVar24._4_4_ = uVar1;
                  auVar24._0_4_ = uVar1;
                  auVar24._8_4_ = uVar1;
                  auVar24._12_4_ = uVar1;
                  auVar24._16_4_ = uVar1;
                  auVar24._20_4_ = uVar1;
                  auVar24._24_4_ = uVar1;
                  auVar24._28_4_ = uVar1;
                  uVar1 = puVar14[1];
                  auVar28._4_4_ = uVar1;
                  auVar28._0_4_ = uVar1;
                  auVar28._8_4_ = uVar1;
                  auVar28._12_4_ = uVar1;
                  auVar28._16_4_ = uVar1;
                  auVar28._20_4_ = uVar1;
                  auVar28._24_4_ = uVar1;
                  auVar28._28_4_ = uVar1;
                  uVar1 = puVar14[2];
                  auVar41._4_4_ = uVar1;
                  auVar41._0_4_ = uVar1;
                  auVar41._8_4_ = uVar1;
                  auVar41._12_4_ = uVar1;
                  auVar41._16_4_ = uVar1;
                  auVar41._20_4_ = uVar1;
                  auVar41._24_4_ = uVar1;
                  auVar41._28_4_ = uVar1;
                  uVar1 = puVar14[3];
                  auVar47._4_4_ = uVar1;
                  auVar47._0_4_ = uVar1;
                  auVar47._8_4_ = uVar1;
                  auVar47._12_4_ = uVar1;
                  auVar47._16_4_ = uVar1;
                  auVar47._20_4_ = uVar1;
                  auVar47._24_4_ = uVar1;
                  auVar47._28_4_ = uVar1;
                  uVar1 = puVar14[4];
                  auVar56._4_4_ = uVar1;
                  auVar56._0_4_ = uVar1;
                  auVar56._8_4_ = uVar1;
                  auVar56._12_4_ = uVar1;
                  auVar56._16_4_ = uVar1;
                  auVar56._20_4_ = uVar1;
                  auVar56._24_4_ = uVar1;
                  auVar56._28_4_ = uVar1;
                  uVar1 = puVar14[5];
                  auVar61._4_4_ = uVar1;
                  auVar61._0_4_ = uVar1;
                  auVar61._8_4_ = uVar1;
                  auVar61._12_4_ = uVar1;
                  auVar61._16_4_ = uVar1;
                  auVar61._20_4_ = uVar1;
                  auVar61._24_4_ = uVar1;
                  auVar61._28_4_ = uVar1;
                  uVar1 = puVar14[6];
                  auVar69._4_4_ = uVar1;
                  auVar69._0_4_ = uVar1;
                  auVar69._8_4_ = uVar1;
                  auVar69._12_4_ = uVar1;
                  auVar69._16_4_ = uVar1;
                  auVar69._20_4_ = uVar1;
                  auVar69._24_4_ = uVar1;
                  auVar69._28_4_ = uVar1;
                  uVar1 = puVar14[7];
                  auVar76._4_4_ = uVar1;
                  auVar76._0_4_ = uVar1;
                  auVar76._8_4_ = uVar1;
                  auVar76._12_4_ = uVar1;
                  auVar76._16_4_ = uVar1;
                  auVar76._20_4_ = uVar1;
                  auVar76._24_4_ = uVar1;
                  auVar76._28_4_ = uVar1;
                  auVar7 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar6 + lVar19 + lVar20),
                                           auVar24,*pauVar11);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar28,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x20));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar41,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x40));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar47,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x60));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar56,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x80));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar61,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0xa0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar69,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0xc0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar76,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0xe0));
                  puVar13 = puVar14 + 8;
                  uVar1 = puVar14[8];
                  auVar29._4_4_ = uVar1;
                  auVar29._0_4_ = uVar1;
                  auVar29._8_4_ = uVar1;
                  auVar29._12_4_ = uVar1;
                  auVar29._16_4_ = uVar1;
                  auVar29._20_4_ = uVar1;
                  auVar29._24_4_ = uVar1;
                  auVar29._28_4_ = uVar1;
                  uVar1 = puVar14[9];
                  auVar25._4_4_ = uVar1;
                  auVar25._0_4_ = uVar1;
                  auVar25._8_4_ = uVar1;
                  auVar25._12_4_ = uVar1;
                  auVar25._16_4_ = uVar1;
                  auVar25._20_4_ = uVar1;
                  auVar25._24_4_ = uVar1;
                  auVar25._28_4_ = uVar1;
                  uVar1 = puVar14[10];
                  auVar42._4_4_ = uVar1;
                  auVar42._0_4_ = uVar1;
                  auVar42._8_4_ = uVar1;
                  auVar42._12_4_ = uVar1;
                  auVar42._16_4_ = uVar1;
                  auVar42._20_4_ = uVar1;
                  auVar42._24_4_ = uVar1;
                  auVar42._28_4_ = uVar1;
                  uVar1 = puVar14[0xb];
                  auVar48._4_4_ = uVar1;
                  auVar48._0_4_ = uVar1;
                  auVar48._8_4_ = uVar1;
                  auVar48._12_4_ = uVar1;
                  auVar48._16_4_ = uVar1;
                  auVar48._20_4_ = uVar1;
                  auVar48._24_4_ = uVar1;
                  auVar48._28_4_ = uVar1;
                  uVar1 = puVar14[0xc];
                  auVar57._4_4_ = uVar1;
                  auVar57._0_4_ = uVar1;
                  auVar57._8_4_ = uVar1;
                  auVar57._12_4_ = uVar1;
                  auVar57._16_4_ = uVar1;
                  auVar57._20_4_ = uVar1;
                  auVar57._24_4_ = uVar1;
                  auVar57._28_4_ = uVar1;
                  uVar1 = puVar14[0xd];
                  auVar62._4_4_ = uVar1;
                  auVar62._0_4_ = uVar1;
                  auVar62._8_4_ = uVar1;
                  auVar62._12_4_ = uVar1;
                  auVar62._16_4_ = uVar1;
                  auVar62._20_4_ = uVar1;
                  auVar62._24_4_ = uVar1;
                  auVar62._28_4_ = uVar1;
                  uVar1 = puVar14[0xe];
                  auVar70._4_4_ = uVar1;
                  auVar70._0_4_ = uVar1;
                  auVar70._8_4_ = uVar1;
                  auVar70._12_4_ = uVar1;
                  auVar70._16_4_ = uVar1;
                  auVar70._20_4_ = uVar1;
                  auVar70._24_4_ = uVar1;
                  auVar70._28_4_ = uVar1;
                  uVar1 = puVar14[0xf];
                  auVar77._4_4_ = uVar1;
                  auVar77._0_4_ = uVar1;
                  auVar77._8_4_ = uVar1;
                  auVar77._12_4_ = uVar1;
                  auVar77._16_4_ = uVar1;
                  auVar77._20_4_ = uVar1;
                  auVar77._24_4_ = uVar1;
                  auVar77._28_4_ = uVar1;
                  auVar7 = vfmadd132ps_fma(auVar29,ZEXT1632(auVar7),
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x100));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar25,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x120));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar42,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x140));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar48,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x160));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar57,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x180));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar62,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x1a0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar70,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x1c0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar77,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x1e0));
                  uVar1 = *puVar16;
                  auVar26._4_4_ = uVar1;
                  auVar26._0_4_ = uVar1;
                  auVar26._8_4_ = uVar1;
                  auVar26._12_4_ = uVar1;
                  auVar26._16_4_ = uVar1;
                  auVar26._20_4_ = uVar1;
                  auVar26._24_4_ = uVar1;
                  auVar26._28_4_ = uVar1;
                  uVar1 = puVar16[1];
                  auVar43._4_4_ = uVar1;
                  auVar43._0_4_ = uVar1;
                  auVar43._8_4_ = uVar1;
                  auVar43._12_4_ = uVar1;
                  auVar43._16_4_ = uVar1;
                  auVar43._20_4_ = uVar1;
                  auVar43._24_4_ = uVar1;
                  auVar43._28_4_ = uVar1;
                  uVar1 = puVar16[2];
                  auVar49._4_4_ = uVar1;
                  auVar49._0_4_ = uVar1;
                  auVar49._8_4_ = uVar1;
                  auVar49._12_4_ = uVar1;
                  auVar49._16_4_ = uVar1;
                  auVar49._20_4_ = uVar1;
                  auVar49._24_4_ = uVar1;
                  auVar49._28_4_ = uVar1;
                  uVar1 = puVar16[3];
                  auVar58._4_4_ = uVar1;
                  auVar58._0_4_ = uVar1;
                  auVar58._8_4_ = uVar1;
                  auVar58._12_4_ = uVar1;
                  auVar58._16_4_ = uVar1;
                  auVar58._20_4_ = uVar1;
                  auVar58._24_4_ = uVar1;
                  auVar58._28_4_ = uVar1;
                  uVar1 = puVar16[4];
                  auVar63._4_4_ = uVar1;
                  auVar63._0_4_ = uVar1;
                  auVar63._8_4_ = uVar1;
                  auVar63._12_4_ = uVar1;
                  auVar63._16_4_ = uVar1;
                  auVar63._20_4_ = uVar1;
                  auVar63._24_4_ = uVar1;
                  auVar63._28_4_ = uVar1;
                  uVar1 = puVar16[5];
                  auVar71._4_4_ = uVar1;
                  auVar71._0_4_ = uVar1;
                  auVar71._8_4_ = uVar1;
                  auVar71._12_4_ = uVar1;
                  auVar71._16_4_ = uVar1;
                  auVar71._20_4_ = uVar1;
                  auVar71._24_4_ = uVar1;
                  auVar71._28_4_ = uVar1;
                  uVar1 = puVar16[6];
                  auVar78._4_4_ = uVar1;
                  auVar78._0_4_ = uVar1;
                  auVar78._8_4_ = uVar1;
                  auVar78._12_4_ = uVar1;
                  auVar78._16_4_ = uVar1;
                  auVar78._20_4_ = uVar1;
                  auVar78._24_4_ = uVar1;
                  auVar78._28_4_ = uVar1;
                  uVar1 = puVar16[7];
                  auVar84._4_4_ = uVar1;
                  auVar84._0_4_ = uVar1;
                  auVar84._8_4_ = uVar1;
                  auVar84._12_4_ = uVar1;
                  auVar84._16_4_ = uVar1;
                  auVar84._20_4_ = uVar1;
                  auVar84._24_4_ = uVar1;
                  auVar84._28_4_ = uVar1;
                  auVar7 = vfmadd132ps_fma(auVar26,ZEXT1632(auVar7),
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x200));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar43,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x220));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar49,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x240));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar58,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x260));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar63,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x280));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar71,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x2a0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar78,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x2c0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar84,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x2e0));
                  uVar1 = puVar16[8];
                  auVar30._4_4_ = uVar1;
                  auVar30._0_4_ = uVar1;
                  auVar30._8_4_ = uVar1;
                  auVar30._12_4_ = uVar1;
                  auVar30._16_4_ = uVar1;
                  auVar30._20_4_ = uVar1;
                  auVar30._24_4_ = uVar1;
                  auVar30._28_4_ = uVar1;
                  uVar1 = puVar16[9];
                  auVar44._4_4_ = uVar1;
                  auVar44._0_4_ = uVar1;
                  auVar44._8_4_ = uVar1;
                  auVar44._12_4_ = uVar1;
                  auVar44._16_4_ = uVar1;
                  auVar44._20_4_ = uVar1;
                  auVar44._24_4_ = uVar1;
                  auVar44._28_4_ = uVar1;
                  uVar1 = puVar16[10];
                  auVar50._4_4_ = uVar1;
                  auVar50._0_4_ = uVar1;
                  auVar50._8_4_ = uVar1;
                  auVar50._12_4_ = uVar1;
                  auVar50._16_4_ = uVar1;
                  auVar50._20_4_ = uVar1;
                  auVar50._24_4_ = uVar1;
                  auVar50._28_4_ = uVar1;
                  uVar1 = puVar16[0xb];
                  auVar59._4_4_ = uVar1;
                  auVar59._0_4_ = uVar1;
                  auVar59._8_4_ = uVar1;
                  auVar59._12_4_ = uVar1;
                  auVar59._16_4_ = uVar1;
                  auVar59._20_4_ = uVar1;
                  auVar59._24_4_ = uVar1;
                  auVar59._28_4_ = uVar1;
                  uVar1 = puVar16[0xc];
                  auVar64._4_4_ = uVar1;
                  auVar64._0_4_ = uVar1;
                  auVar64._8_4_ = uVar1;
                  auVar64._12_4_ = uVar1;
                  auVar64._16_4_ = uVar1;
                  auVar64._20_4_ = uVar1;
                  auVar64._24_4_ = uVar1;
                  auVar64._28_4_ = uVar1;
                  uVar1 = puVar16[0xd];
                  auVar72._4_4_ = uVar1;
                  auVar72._0_4_ = uVar1;
                  auVar72._8_4_ = uVar1;
                  auVar72._12_4_ = uVar1;
                  auVar72._16_4_ = uVar1;
                  auVar72._20_4_ = uVar1;
                  auVar72._24_4_ = uVar1;
                  auVar72._28_4_ = uVar1;
                  uVar1 = puVar16[0xe];
                  auVar79._4_4_ = uVar1;
                  auVar79._0_4_ = uVar1;
                  auVar79._8_4_ = uVar1;
                  auVar79._12_4_ = uVar1;
                  auVar79._16_4_ = uVar1;
                  auVar79._20_4_ = uVar1;
                  auVar79._24_4_ = uVar1;
                  auVar79._28_4_ = uVar1;
                  uVar1 = puVar16[0xf];
                  auVar85._4_4_ = uVar1;
                  auVar85._0_4_ = uVar1;
                  auVar85._8_4_ = uVar1;
                  auVar85._12_4_ = uVar1;
                  auVar85._16_4_ = uVar1;
                  auVar85._20_4_ = uVar1;
                  auVar85._24_4_ = uVar1;
                  auVar85._28_4_ = uVar1;
                  auVar7 = vfmadd132ps_fma(auVar30,ZEXT1632(auVar7),
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x300));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar44,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 800));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar50,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x340));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar59,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x360));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar64,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x380));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar72,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x3a0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar79,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x3c0));
                  puVar16 = puVar16 + 8;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar85,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar19 + lVar20 + 0x3e0));
                  *pauVar11 = ZEXT1632(auVar7);
                  pauVar11 = pauVar11 + 1;
                  iVar18 = iVar18 + -1;
                  puVar14 = puVar13;
                } while (iVar18 != 0);
              }
              puVar13 = puVar13 + 8;
              puVar16 = puVar16 + 8;
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar4);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar5);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != iVar2);
  }
  return;
}

Assistant:

static void conv2x2s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);

            const float* kptr = (const float*)kernel.channel(p).row(q);
            // const float* kptr = (const float*)kernel + 4 * inch * p * 64;

            int i = 0;
            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);
                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    //========================================

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum0);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);
                    outptr0 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum = _mm256_loadu_ps(outptr0);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);

                    //========================================
                    r0 += 8;
                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum);
                    outptr0 += 8;
                }

                r0 += 8;
                r1 += 8;
            }
        }
    }
}